

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall Kvm::addBindingToFrame(Kvm *this,Value *var,Value *val,Value *frame)

{
  pointer *ppppVVar1;
  Value *result;
  Value *local_30;
  
  local_30 = (Value *)0x0;
  Kgc::pushLocalStackRoot(&this->gc_,&local_30);
  local_30 = makeCell(this,var,(Value *)frame[1]._vptr_Value);
  set_car(frame,local_30);
  local_30 = makeCell(this,val,*(Value **)&frame[1].type_);
  set_cdr(frame,local_30);
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -1;
  return;
}

Assistant:

void Kvm::addBindingToFrame(const Value *var, const Value *val, const Value *frame)
{
    const Value *result = nullptr;
    gc_.pushLocalStackRoot(&result);
    
    result = makeCell(var, car(frame));
    set_car(const_cast<Value *>(frame), result);
    
    result = makeCell(val, cdr(frame));
    set_cdr(const_cast<Value *>(frame), result);
    
    gc_.popLocalStackRoot();
}